

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void basic_suite::fail_nul(void)

{
  char input [4];
  decoder_type decoder;
  value_type local_15c [4];
  undefined4 local_158;
  value local_154;
  basic_decoder<char> local_150;
  
  local_150.input.tail = local_15c + 3;
  builtin_memcpy(local_15c,"nul",4);
  local_150.input.head = local_15c;
  memset(&local_150.current,0,0x120);
  local_150.current.code = uninitialized;
  local_150.current.view.head = (const_pointer)0x0;
  local_150.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_150);
  local_154 = local_150.current.code;
  local_158 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xf0,"void basic_suite::fail_nul()",&local_154,&local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.literal()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xf1,"void basic_suite::fail_nul()",&local_150.current.view,"");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[4]>
            ("decoder.tail()","\"nul\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xf2,"void basic_suite::fail_nul()",&local_150,"nul");
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}